

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImDrawList::~ImDrawList(ImDrawList *this)

{
  int *piVar1;
  ImDrawChannel *pIVar2;
  ImVec2 *pIVar3;
  void **ppvVar4;
  ImVec4 *pIVar5;
  ImDrawVert *pIVar6;
  uint *puVar7;
  ImDrawCmd *pIVar8;
  
  ClearFreeMemory(this);
  ImDrawListSplitter::ClearFreeMemory(&this->_Splitter);
  pIVar2 = (this->_Splitter)._Channels.Data;
  if (pIVar2 != (ImDrawChannel *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
  }
  pIVar3 = (this->_Path).Data;
  if (pIVar3 != (ImVec2 *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
  }
  ppvVar4 = (this->_TextureIdStack).Data;
  if (ppvVar4 != (void **)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ppvVar4,GImAllocatorUserData);
  }
  pIVar5 = (this->_ClipRectStack).Data;
  if (pIVar5 != (ImVec4 *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
  }
  pIVar6 = (this->VtxBuffer).Data;
  if (pIVar6 != (ImDrawVert *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
  }
  puVar7 = (this->IdxBuffer).Data;
  if (puVar7 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
  }
  pIVar8 = (this->CmdBuffer).Data;
  if (pIVar8 != (ImDrawCmd *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
  }
  return;
}

Assistant:

~ImDrawList() { ClearFreeMemory(); }